

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_callermsg(lua_State *L,char *msg)

{
  long lVar1;
  uint *puVar2;
  long in_RDI;
  TValue *pframe;
  TValue *frame;
  cTValue *in_stack_00000028;
  cTValue *in_stack_00000030;
  char *in_stack_00000038;
  lua_State *in_stack_00000040;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  puVar2 = (uint *)(lVar1 + -8);
  if (((((*(uint *)(lVar1 + -4) & 3) != 0) && ((*(uint *)(lVar1 + -4) & 7) == 2)) &&
      (*(int *)(lVar1 + -0x10) != 1)) &&
     ((0xa2 < *(byte *)((ulong)*puVar2 + 6) && (*(byte *)((ulong)*puVar2 + 6) < 0xb3)))) {
    *(ulong *)(in_RDI + 0x10) =
         (long)puVar2 + (8 - ((long)*(int *)(lVar1 + -4) & 0xfffffffffffffff8U));
    *(uint **)(in_RDI + 0x18) = puVar2;
    *(undefined4 *)((*(ulong *)(in_RDI + 0x30) & 0xfffffffffffffffc) + 0x1c) =
         *(undefined4 *)(lVar1 + -0xc);
  }
  lj_debug_addloc(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  lj_err_run((lua_State *)&pframe->field_2);
}

Assistant:

LJ_NOINLINE void lj_err_callermsg(lua_State *L, const char *msg)
{
  TValue *frame = L->base-1;
  TValue *pframe = NULL;
  if (frame_islua(frame)) {
    pframe = frame_prevl(frame);
  } else if (frame_iscont(frame)) {
    if (frame_iscont_fficb(frame)) {
      pframe = frame;
      frame = NULL;
    } else {
      pframe = frame_prevd(frame);
#if LJ_HASFFI
      /* Remove frame for FFI metamethods. */
      if (frame_func(frame)->c.ffid >= FF_ffi_meta___index &&
	  frame_func(frame)->c.ffid <= FF_ffi_meta___tostring) {
	L->base = pframe+1;
	L->top = frame;
	setcframe_pc(cframe_raw(L->cframe), frame_contpc(frame));
      }
#endif
    }
  }
  lj_debug_addloc(L, msg, pframe, frame);
  lj_err_run(L);
}